

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopPolicy(cmMakefile *this)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_10 = this;
  bVar1 = cmStateSnapshot::PopPolicy(&this->StateSnapshot);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"cmake_policy POP without matching PUSH",&local_31);
    IssueMessage(this,FATAL_ERROR,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return;
}

Assistant:

void cmMakefile::PopPolicy()
{
  if (!this->StateSnapshot.PopPolicy()) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "cmake_policy POP without matching PUSH");
  }
}